

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O3

parser_error parse_quest_place(parser *p)

{
  undefined8 *puVar1;
  _Bool _Var2;
  wchar_t wVar3;
  errr eVar4;
  parser_error pVar5;
  int iVar6;
  undefined8 in_RAX;
  void *pvVar7;
  char *pcVar8;
  undefined8 *puVar9;
  level_conflict *plVar10;
  undefined1 uVar11;
  wchar_t i;
  locality local_24;
  
  local_24 = (locality)((ulong)in_RAX >> 0x20);
  pvVar7 = parser_priv(p);
  pcVar8 = parser_getsym(p,"locality");
  wVar3 = parser_getint(p,"depth");
  puVar1 = *(undefined8 **)((long)pvVar7 + 0x18);
  if (*(undefined8 **)((long)pvVar7 + 0x18) == (undefined8 *)0x0) {
    __assert_fail("q->place",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-quest.c"
                  ,0x9d,"enum parser_error parse_quest_place(struct parser *)");
  }
  do {
    puVar9 = puVar1;
    puVar1 = (undefined8 *)puVar9[2];
  } while ((undefined8 *)puVar9[2] != (undefined8 *)0x0);
  eVar4 = grab_name("locality",pcVar8,localities,0x27,(int *)&local_24);
  pVar5 = PARSE_ERROR_INVALID_LOCALITY;
  if (eVar4 == 0) {
    pcVar8 = locality_name(local_24);
    pcVar8 = format("%s %d",pcVar8,(ulong)(uint)wVar3);
    pcVar8 = string_make(pcVar8);
    if ((level_map_conflict *)*puVar9 == (level_map_conflict *)0x0) {
      pVar5 = PARSE_ERROR_INVALID_MAP;
    }
    else {
      plVar10 = level_by_name((level_map_conflict *)*puVar9,pcVar8);
      *(int *)(puVar9 + 1) = plVar10->index;
      string_free(pcVar8);
      _Var2 = parser_hasval(p,"block");
      uVar11 = 0;
      if (_Var2) {
        pcVar8 = parser_getsym(p,"block");
        iVar6 = strcmp(pcVar8,"block");
        if (iVar6 != 0) {
          return PARSE_ERROR_INVALID_STRING;
        }
        uVar11 = 1;
      }
      *(undefined1 *)((long)puVar9 + 0xc) = uVar11;
      pVar5 = PARSE_ERROR_NONE;
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_quest_place(struct parser *p) {
	struct quest *q = parser_priv(p);
	const char *loc_name = parser_getsym(p, "locality");
	const int depth = parser_getint(p, "depth");
	struct quest_place *q_place = q->place;
	char *lev_name;
	const char *block;
	int i;
	assert(q);
	assert(q->place);

	while (q_place->next) {
		q_place = q_place->next;
	}

	if (grab_name("locality", loc_name, localities, N_ELEMENTS(localities), &i))
		return PARSE_ERROR_INVALID_LOCALITY;
	lev_name = string_make(format("%s %d", locality_name(i), depth));
	if (!q_place->map) return PARSE_ERROR_INVALID_MAP;
	q_place->place = level_by_name(q_place->map, lev_name)->index;
	string_free(lev_name);

	if (parser_hasval(p, "block")) {
		block = parser_getsym(p, "block");
		if (streq(block, "block")) {
			q_place->block = true;
		} else {
			return PARSE_ERROR_INVALID_STRING;
		}
	} else {
		q_place->block = false;
	}
	return PARSE_ERROR_NONE;
}